

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

uint8_t duckdb::StringUtil::GetBinaryValue(char c)

{
  InvalidInputException *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((c & 0xfeU) == 0x30) {
    return c + 0xd0;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"Invalid input for binary digit: %s",&local_59);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static uint8_t GetBinaryValue(char c) {
		if (c >= '0' && c <= '1') {
			return UnsafeNumericCast<uint8_t>(c - '0');
		}
		throw InvalidInputException("Invalid input for binary digit: %s", string(1, c));
	}